

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O1

int __thiscall GdlPass::MachineClassKey(GdlPass *this,gid16 wGlyphID,int nPassID)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  undefined2 in_register_00000032;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (_Rb_tree_node_base *)
           ((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color
           + (ulong)(uint)(CONCAT22(in_register_00000032,wGlyphID) * 0x30));
  p_Var1 = *(_Rb_tree_node_base **)
            ((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            + (ulong)(uint)(CONCAT22(in_register_00000032,wGlyphID) * 0x30));
  if (p_Var1 == p_Var3) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + *(int *)(*(long *)(*(long *)(p_Var1 + 1) + 0xe8) + (long)nPassID * 4);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != p_Var3);
  }
  return iVar2;
}

Assistant:

int GdlPass::MachineClassKey(gid16 wGlyphID, int nPassID)
{
	SourceClassSet * pscs = m_rgscsInclusions + wGlyphID;
	int nKey = 0;
	for (SourceClassSet::iterator itscs = pscs->begin();
		itscs != pscs->end();
		++itscs)
	{
		Assert((*itscs)->FsmID(nPassID) > -1);
		nKey += (*itscs)->FsmID(nPassID);
	}
	return nKey;
}